

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

SchemaCatalogEntry * __thiscall
duckdb::Catalog::GetSchema(Catalog *this,ClientContext *context,EntryLookupInfo *schema_lookup)

{
  SchemaCatalogEntry *pSVar1;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_8;
  
  local_8 = GetSchema(this,context,schema_lookup,THROW_EXCEPTION);
  pSVar1 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator*(&local_8);
  return pSVar1;
}

Assistant:

SchemaCatalogEntry &Catalog::GetSchema(ClientContext &context, const EntryLookupInfo &schema_lookup) {
	return *Catalog::GetSchema(context, schema_lookup, OnEntryNotFound::THROW_EXCEPTION);
}